

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateDescriptorMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  JavaType JVar2;
  Descriptor *pDVar3;
  FieldGeneratorInfo *pFVar4;
  char *pcVar5;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar6;
  long lVar7;
  ulong uVar8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_d0;
  FieldDescriptor *field;
  size_type local_a8;
  FieldDescriptor local_a0 [32];
  MessageBuilderGenerator *local_80;
  Printer *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x49) == '\0') {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&field,this->name_resolver_,*(FileDescriptor **)(this->descriptor_ + 0x10),
               true);
    UniqueFileScopeIdentifier_abi_cxx11_(&local_d0,(java *)this->descriptor_,descriptor);
    io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
               ,(char (*) [10])"fileclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
               (char (*) [11])0x3e5b80,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (field != local_a0) {
      operator_delete(field);
    }
  }
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar3 = this->descriptor_;
  if (0 < *(int *)(pDVar3 + 4)) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      field = (FieldDescriptor *)(*(long *)(pDVar3 + 0x28) + lVar6);
      JVar2 = GetJavaType(field);
      if (JVar2 == JAVATYPE_MESSAGE) {
        pDVar3 = FieldDescriptor::message_type(field);
        if (*(char *)(*(long *)(pDVar3 + 0x20) + 0x4b) == '\x01') {
          if (map_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              map_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&map_fields,
                       (iterator)
                       map_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&field);
          }
          else {
            *map_fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = field;
            map_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      lVar7 = lVar7 + 1;
      pDVar3 = this->descriptor_;
      lVar6 = lVar6 + 0x48;
    } while (lVar7 < *(int *)(pDVar3 + 4));
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Print<>
              (printer,
               "@SuppressWarnings({\"rawtypes\"})\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
              );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    local_80 = this;
    local_78 = printer;
    if (map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar8 = 0;
      do {
        pFVar1 = map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8];
        pFVar4 = Context::GetFieldGeneratorInfo(this->context_,pFVar1);
        field = local_a0;
        pcVar5 = FastInt32ToBufferLeft(*(int32 *)(pFVar1 + 4),(char *)local_a0);
        local_a8 = (long)pcVar5 - (long)local_a0;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,field,field + local_a8);
        printer = local_78;
        io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                  (local_78,"case $number$:\n  return internalGet$capitalized_name$();\n",
                   (char (*) [7])0x40a31d,&local_d0,(char (*) [17])0x409e33,
                   &pFVar4->capitalized_name);
        this = local_80;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    io::Printer::Print<>
              (printer,
               "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
              );
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"  }\n}\n");
    io::Printer::Print<>
              (printer,
               "@SuppressWarnings({\"rawtypes\"})\nprotected com.google.protobuf.MapField internalGetMutableMapField(\n    int number) {\n  switch (number) {\n"
              );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar8 = 0;
      do {
        pFVar1 = map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8];
        pFVar4 = Context::GetFieldGeneratorInfo(this->context_,pFVar1);
        field = local_a0;
        pcVar5 = FastInt32ToBufferLeft(*(int32 *)(pFVar1 + 4),(char *)local_a0);
        local_a8 = (long)pcVar5 - (long)local_a0;
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,field,field + local_a8);
        printer = local_78;
        io::Printer::Print<char[7],std::__cxx11::string,char[17],std::__cxx11::string>
                  (local_78,"case $number$:\n  return internalGetMutable$capitalized_name$();\n",
                   (char (*) [7])0x40a31d,&local_d0,(char (*) [17])0x409e33,
                   &pFVar4->capitalized_name);
        this = local_80;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (ulong)((long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    io::Printer::Print<>
              (printer,
               "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
              );
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print<>(printer,"  }\n}\n");
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&field,this->name_resolver_,this->descriptor_,true);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_d0,this->name_resolver_,*(FileDescriptor **)(this->descriptor_ + 0x10),true);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_50,(java *)this->descriptor_,descriptor_00);
  local_70.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_70._M_string_length = 2;
  local_70.field_2._M_local_buf[2] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[10],std::__cxx11::string,char[11],std::__cxx11::string,char[4],std::__cxx11::string>
            (printer,
             "@java.lang.Override\nprotected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
             ,(char (*) [10])0x3f42d2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field,
             (char (*) [10])"fileclass",&local_d0,(char (*) [11])0x3e5b80,&local_50,
             (char (*) [4])0x3e4f76,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (field != local_a0) {
    operator_delete(field);
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(map_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateDescriptorMethods(io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
        "public static final com.google.protobuf.Descriptors.Descriptor\n"
        "    getDescriptor() {\n"
        "  return $fileclass$.internal_$identifier$_descriptor;\n"
        "}\n"
        "\n",
        "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
        "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "protected com.google.protobuf.MapField internalGetMapField(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGet$capitalized_name$();\n",
          "number", StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
    printer->Print(
        "@SuppressWarnings({\"rawtypes\"})\n"
        "protected com.google.protobuf.MapField internalGetMutableMapField(\n"
        "    int number) {\n"
        "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
          "case $number$:\n"
          "  return internalGetMutable$capitalized_name$();\n",
          "number", StrCat(field->number()), "capitalized_name",
          info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
      "@java.lang.Override\n"
      "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
      "    internalGetFieldAccessorTable() {\n"
      "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
      "      .ensureFieldAccessorsInitialized(\n"
      "          $classname$.class, $classname$.Builder.class);\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_), "ver",
      GeneratedCodeVersionSuffix());
}